

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

void __thiscall
Eigen::SparseMatrix<float,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseMatrix<float,1,int> *this,Matrix<int,__1,_1,_0,__1,_1> *reserveSizes)

{
  Scalar SVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  void *pvVar6;
  CoeffReturnType piVar7;
  int *piVar8;
  char *pcVar9;
  Scalar *pSVar10;
  int __c;
  int __c_00;
  long lVar11;
  long extraout_RDX;
  Index IVar12;
  Index extraout_RDX_00;
  long local_98;
  Index i_1;
  StorageIndex innerNNZ_1;
  Index offset;
  Index j_3;
  StorageIndex toReserve;
  StorageIndex alreadyReserved;
  Index j_2;
  int *piStack_60;
  StorageIndex count_1;
  StorageIndex *newOuterIndex_1;
  Index i;
  long lStack_48;
  StorageIndex innerNNZ;
  Index j_1;
  long lStack_38;
  StorageIndex previousOuterIndex;
  Index j;
  long lStack_28;
  StorageIndex count;
  StorageIndex *newOuterIndex;
  Index totalReserveSize;
  Matrix<int,__1,_1,_0,__1,_1> *reserveSizes_local;
  SparseMatrix<float,_1,_int> *this_local;
  
  totalReserveSize = (Index)reserveSizes;
  reserveSizes_local = (Matrix<int,__1,_1,_0,__1,_1> *)this;
  bVar5 = SparseCompressedBase<Eigen::SparseMatrix<float,_1,_int>_>::isCompressed
                    ((SparseCompressedBase<Eigen::SparseMatrix<float,_1,_int>_> *)this);
  if (bVar5) {
    newOuterIndex = (StorageIndex *)0x0;
    pvVar6 = malloc(*(long *)(this + 8) << 2);
    *(void **)(this + 0x20) = pvVar6;
    if (*(long *)(this + 0x20) == 0) {
      internal::throw_std_bad_alloc();
    }
    lStack_28 = *(long *)(this + 0x20);
    j._4_4_ = 0;
    for (lStack_38 = 0; lStack_38 < *(long *)(this + 8); lStack_38 = lStack_38 + 1) {
      *(int *)(lStack_28 + lStack_38 * 4) = j._4_4_;
      piVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                          totalReserveSize,lStack_38);
      j._4_4_ = *piVar7 + (*(int *)(*(long *)(this + 0x18) + 4 + lStack_38 * 4) -
                          *(int *)(*(long *)(this + 0x18) + lStack_38 * 4)) + j._4_4_;
      piVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                          totalReserveSize,lStack_38);
      newOuterIndex = (StorageIndex *)((long)*piVar7 + (long)newOuterIndex);
    }
    internal::CompressedStorage<float,_int>::reserve
              ((CompressedStorage<float,_int> *)(this + 0x28),(Index)newOuterIndex);
    j_1._4_4_ = *(int *)(*(long *)(this + 0x18) + *(long *)(this + 8) * 4);
    lStack_48 = *(long *)(this + 8);
    while (lStack_48 = lStack_48 + -1, -1 < lStack_48) {
      i._4_4_ = j_1._4_4_ - *(int *)(*(long *)(this + 0x18) + lStack_48 * 4);
      lVar11 = lStack_48;
      for (newOuterIndex_1 = (StorageIndex *)(long)(i._4_4_ + -1); -1 < (long)newOuterIndex_1;
          newOuterIndex_1 = (StorageIndex *)((long)newOuterIndex_1 + -1)) {
        pcVar9 = internal::CompressedStorage<float,_int>::index
                           ((CompressedStorage<float,_int> *)(this + 0x28),
                            (char *)((long)*(int *)(*(long *)(this + 0x18) + lStack_48 * 4) +
                                    (long)newOuterIndex_1),(int)lVar11);
        uVar4 = *(undefined4 *)pcVar9;
        pcVar9 = internal::CompressedStorage<float,_int>::index
                           ((CompressedStorage<float,_int> *)(this + 0x28),
                            (char *)((long)*(int *)(lStack_28 + lStack_48 * 4) +
                                    (long)newOuterIndex_1),__c);
        *(undefined4 *)pcVar9 = uVar4;
        pSVar10 = internal::CompressedStorage<float,_int>::value
                            ((CompressedStorage<float,_int> *)(this + 0x28),
                             (long)*(int *)(*(long *)(this + 0x18) + lStack_48 * 4) +
                             (long)newOuterIndex_1);
        SVar1 = *pSVar10;
        pSVar10 = internal::CompressedStorage<float,_int>::value
                            ((CompressedStorage<float,_int> *)(this + 0x28),
                             (long)*(int *)(lStack_28 + lStack_48 * 4) + (long)newOuterIndex_1);
        *pSVar10 = SVar1;
        lVar11 = extraout_RDX;
      }
      j_1._4_4_ = *(int *)(*(long *)(this + 0x18) + lStack_48 * 4);
      *(undefined4 *)(*(long *)(this + 0x18) + lStack_48 * 4) =
           *(undefined4 *)(lStack_28 + lStack_48 * 4);
      *(int *)(*(long *)(this + 0x20) + lStack_48 * 4) = i._4_4_;
    }
    if (0 < *(long *)(this + 8)) {
      iVar2 = *(int *)(*(long *)(this + 0x18) + (*(long *)(this + 8) + -1) * 4);
      iVar3 = *(int *)(*(long *)(this + 0x20) + (*(long *)(this + 8) + -1) * 4);
      piVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                          totalReserveSize,*(long *)(this + 8) + -1);
      *(int *)(*(long *)(this + 0x18) + *(long *)(this + 8) * 4) = iVar2 + iVar3 + *piVar7;
    }
    internal::CompressedStorage<float,_int>::resize
              ((CompressedStorage<float,_int> *)(this + 0x28),
               (long)*(int *)(*(long *)(this + 0x18) + *(long *)(this + 8) * 4),0.0);
  }
  else {
    piStack_60 = (int *)malloc((*(long *)(this + 8) + 1) * 4);
    if (piStack_60 == (int *)0x0) {
      internal::throw_std_bad_alloc();
    }
    j_2._4_4_ = 0;
    for (_toReserve = 0; _toReserve < *(long *)(this + 8); _toReserve = _toReserve + 1) {
      piStack_60[_toReserve] = j_2._4_4_;
      j_3._4_4_ = (*(int *)(*(long *)(this + 0x18) + 4 + _toReserve * 4) -
                  *(int *)(*(long *)(this + 0x18) + _toReserve * 4)) -
                  *(int *)(*(long *)(this + 0x20) + _toReserve * 4);
      piVar7 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0> *)
                          totalReserveSize,_toReserve);
      piVar8 = std::max<int>(piVar7,(int *)((long)&j_3 + 4));
      j_3._0_4_ = *piVar8;
      j_2._4_4_ = (int)j_3 + *(int *)(*(long *)(this + 0x20) + _toReserve * 4) + j_2._4_4_;
    }
    piStack_60[*(long *)(this + 8)] = j_2._4_4_;
    internal::CompressedStorage<float,_int>::resize
              ((CompressedStorage<float,_int> *)(this + 0x28),(long)j_2._4_4_,0.0);
    offset = *(Index *)(this + 8);
    while (offset = offset + -1, -1 < offset) {
      if (0 < piStack_60[offset] - *(int *)(*(long *)(this + 0x18) + offset * 4)) {
        IVar12 = offset;
        for (local_98 = (long)(*(int *)(*(long *)(this + 0x20) + offset * 4) + -1); -1 < local_98;
            local_98 = local_98 + -1) {
          pcVar9 = internal::CompressedStorage<float,_int>::index
                             ((CompressedStorage<float,_int> *)(this + 0x28),
                              (char *)(*(int *)(*(long *)(this + 0x18) + offset * 4) + local_98),
                              (int)IVar12);
          uVar4 = *(undefined4 *)pcVar9;
          pcVar9 = internal::CompressedStorage<float,_int>::index
                             ((CompressedStorage<float,_int> *)(this + 0x28),
                              (char *)(piStack_60[offset] + local_98),__c_00);
          *(undefined4 *)pcVar9 = uVar4;
          pSVar10 = internal::CompressedStorage<float,_int>::value
                              ((CompressedStorage<float,_int> *)(this + 0x28),
                               *(int *)(*(long *)(this + 0x18) + offset * 4) + local_98);
          SVar1 = *pSVar10;
          pSVar10 = internal::CompressedStorage<float,_int>::value
                              ((CompressedStorage<float,_int> *)(this + 0x28),
                               piStack_60[offset] + local_98);
          *pSVar10 = SVar1;
          IVar12 = extraout_RDX_00;
        }
      }
    }
    std::swap<int*>((int **)(this + 0x18),&stack0xffffffffffffffa0);
    free(piStack_60);
  }
  return;
}

Assistant:

inline void reserveInnerVectors(const SizesType& reserveSizes)
    {
      if(isCompressed())
      {
        Index totalReserveSize = 0;
        // turn the matrix into non-compressed mode
        m_innerNonZeros = static_cast<StorageIndex*>(std::malloc(m_outerSize * sizeof(StorageIndex)));
        if (!m_innerNonZeros) internal::throw_std_bad_alloc();
        
        // temporarily use m_innerSizes to hold the new starting points.
        StorageIndex* newOuterIndex = m_innerNonZeros;
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          count += reserveSizes[j] + (m_outerIndex[j+1]-m_outerIndex[j]);
          totalReserveSize += reserveSizes[j];
        }
        m_data.reserve(totalReserveSize);
        StorageIndex previousOuterIndex = m_outerIndex[m_outerSize];
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          StorageIndex innerNNZ = previousOuterIndex - m_outerIndex[j];
          for(Index i=innerNNZ-1; i>=0; --i)
          {
            m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
            m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
          }
          previousOuterIndex = m_outerIndex[j];
          m_outerIndex[j] = newOuterIndex[j];
          m_innerNonZeros[j] = innerNNZ;
        }
        if(m_outerSize>0)
          m_outerIndex[m_outerSize] = m_outerIndex[m_outerSize-1] + m_innerNonZeros[m_outerSize-1] + reserveSizes[m_outerSize-1];
        
        m_data.resize(m_outerIndex[m_outerSize]);
      }
      else
      {
        StorageIndex* newOuterIndex = static_cast<StorageIndex*>(std::malloc((m_outerSize+1)*sizeof(StorageIndex)));
        if (!newOuterIndex) internal::throw_std_bad_alloc();
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          StorageIndex alreadyReserved = (m_outerIndex[j+1]-m_outerIndex[j]) - m_innerNonZeros[j];
          StorageIndex toReserve = std::max<StorageIndex>(reserveSizes[j], alreadyReserved);
          count += toReserve + m_innerNonZeros[j];
        }
        newOuterIndex[m_outerSize] = count;
        
        m_data.resize(count);
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          Index offset = newOuterIndex[j] - m_outerIndex[j];
          if(offset>0)
          {
            StorageIndex innerNNZ = m_innerNonZeros[j];
            for(Index i=innerNNZ-1; i>=0; --i)
            {
              m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
              m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
            }
          }
        }
        
        std::swap(m_outerIndex, newOuterIndex);
        std::free(newOuterIndex);
      }
      
    }